

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::RALocalAllocator::switchToAssignment
          (RALocalAllocator *this,PhysToWorkMap *dstPhysToWorkMap,WorkToPhysMap *dstWorkToPhysMap,
          ZoneBitVector *liveIn,bool dstReadOnly,bool tryMode)

{
  RAAssignment *other;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Error EVar6;
  BitWordIterator<unsigned_int> BVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t *puVar11;
  uint32_t group;
  long lVar12;
  RAAssignment *this_00;
  undefined7 in_register_00000089;
  uint uVar13;
  int local_b4;
  BitWordIterator<unsigned_int> it;
  uint32_t local_9c;
  uint local_90;
  RAAssignment dst;
  
  RAAssignment::RAAssignment(&dst);
  RAAssignment::initLayout(&dst,&this->_pass->_physRegCount,&this->_pass->_workRegs);
  RAAssignment::initMaps(&dst,dstPhysToWorkMap,dstWorkToPhysMap);
  if ((int)CONCAT71(in_register_00000089,tryMode) == 0) {
    other = &this->_curAssignment;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      group = (uint32_t)lVar12;
      it._bitWord = RAAssignment::assigned(other,group);
      while (it._bitWord != 0) {
        uVar3 = Support::BitWordIterator<unsigned_int>::next(&it);
        uVar4 = RAAssignment::physToWorkId(other,group,uVar3);
        if (uVar4 == 0xffffffff) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                     ,0xb6,"workId != RAAssignment::kWorkNone");
        }
        bVar1 = ZoneBitVector::bitAt(liveIn,uVar4);
        if (bVar1) {
          uVar5 = RAAssignment::workToPhysId(&dst,group,uVar4);
          if ((uVar5 == 0xff) && (EVar6 = onSpillReg(this,group,uVar4,uVar3), EVar6 != 0)) {
            return EVar6;
          }
        }
        else {
          RAAssignment::unassign(other,group,uVar4,uVar3);
        }
      }
      local_9c = RAAssignment::assigned(&dst,group);
      local_90 = 0;
      local_b4 = -1;
      while (local_9c != 0) {
        local_b4 = local_b4 + 1;
        if (local_b4 == 2) {
          return 3;
        }
        it._bitWord = local_9c;
        BVar7._bitWord = 1;
LAB_00117bae:
        if (BVar7._bitWord != 0) {
          uVar3 = Support::BitWordIterator<unsigned_int>::next(&it);
          uVar13 = 1 << ((byte)uVar3 & 0x1f);
          uVar4 = RAAssignment::physToWorkId(other,group,uVar3);
          uVar5 = RAAssignment::physToWorkId(&dst,group,uVar3);
          if (uVar5 == 0xffffffff) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                       ,0xe6,"dstWorkId != RAAssignment::kWorkNone");
          }
          uVar8 = ~uVar13;
          if (uVar4 == 0xffffffff) goto LAB_00117d5c;
          if (uVar4 != uVar5) goto code_r0x00117c11;
          goto LAB_00117dc1;
        }
      }
      it._bitWord = local_90;
      while (it._bitWord != 0) {
        uVar3 = Support::BitWordIterator<unsigned_int>::next(&it);
        bVar1 = RAAssignment::isPhysAssigned(other,group,uVar3);
        if (bVar1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                     ,0x159,"tryMode == true");
        }
        uVar4 = RAAssignment::physToWorkId(&dst,group,uVar3);
        bVar1 = ZoneBitVector::bitAt(liveIn,uVar4);
        if (!bVar1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                     ,0x150,"liveIn.bitAt(workId) == true");
        }
        EVar6 = onLoadReg(this,group,uVar4,uVar3);
        if (EVar6 != 0) {
          return EVar6;
        }
        bVar1 = RAAssignment::isPhysDirty(&dst,group,uVar3);
        if (bVar1) {
          RAAssignment::makeDirty(other,group,uVar4,uVar3);
        }
        bVar1 = RAAssignment::isPhysDirty(&dst,group,uVar3);
        bVar2 = RAAssignment::isPhysDirty(other,group,uVar3);
        if (bVar1 != bVar2) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                     ,0x155,"dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId)");
        }
      }
    }
    bVar1 = RAAssignment::equals(&dst,other);
    if (!bVar1) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                 ,0x173,"dst.equals(cur)");
    }
  }
  return 0;
code_r0x00117c11:
  BVar7 = it;
  if ((local_b4 < 1) ||
     (uVar9 = RAAssignment::workToPhysId(other,group,uVar5), BVar7 = it, uVar9 == 0xff))
  goto LAB_00117bae;
  if ((this->_archTraits->_isaFlags[lVar12] & 1) == 0) {
    bVar1 = RAAssignment::isPhysDirty(other,group,uVar3);
    if (bVar1) {
      puVar11 = RARegMask::operator[](&this->_pass->_availableRegs,group);
      uVar10 = *puVar11;
      uVar9 = RAAssignment::assigned(other,group);
      uVar10 = ~uVar9 & uVar10;
      uVar9 = RAAssignment::assigned(&dst,group);
      if ((uVar10 & ~uVar9) != 0) {
        uVar9 = RAAssignment::assigned(&dst,group);
        uVar10 = uVar10 & ~uVar9;
      }
      if (uVar10 != 0) {
        uVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        EVar6 = onMoveReg(this,group,uVar4,uVar9,uVar3);
        if (EVar6 != 0) {
          return EVar6;
        }
        puVar11 = RARegMask::operator[](&this->_pass->_clobberedRegs,group);
        *puVar11 = *puVar11 | 1 << ((byte)uVar9 & 0x1f);
        goto LAB_00117d51;
      }
      EVar6 = onSpillReg(this,group,uVar4,uVar3);
      local_b4 = -1;
      if (EVar6 != 0) {
        return EVar6;
      }
    }
    else {
      RAAssignment::unassign(other,group,uVar4,uVar3);
LAB_00117d51:
      local_b4 = -1;
    }
LAB_00117d5c:
    uVar4 = RAAssignment::workToPhysId(other,group,uVar5);
    if (uVar4 == 0xff) {
      bVar1 = ZoneBitVector::bitAt(liveIn,uVar5);
      if (!bVar1) {
        uVar13 = 0;
      }
      local_90 = local_90 | uVar13;
      local_9c = local_9c & uVar8;
      BVar7 = it;
      goto LAB_00117bae;
    }
    EVar6 = onMoveReg(this,group,uVar5,uVar3,uVar4);
  }
  else {
    EVar6 = onSwapReg(this,group,uVar4,uVar3,uVar5,uVar9);
  }
  if (EVar6 != 0) {
    return EVar6;
  }
LAB_00117dc1:
  uVar4 = RAAssignment::dirty(&dst,group);
  uVar9 = RAAssignment::dirty(other,group);
  if (((uVar9 ^ uVar4) & uVar13) != 0) {
    uVar4 = RAAssignment::dirty(&dst,group);
    bVar1 = RAAssignment::isPhysDirty(&dst,group,uVar3);
    if ((uVar4 & uVar13) == 0) {
      if ((bVar1) || (bVar1 = RAAssignment::isPhysDirty(other,group,uVar3), !bVar1)) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                   ,0x127,"!dst.isPhysDirty(group, physId) && cur.isPhysDirty(group, physId)");
      }
      this_00 = &dst;
      if (dstReadOnly) {
        EVar6 = onSaveReg(this,group,uVar5,uVar3);
        if (EVar6 != 0) {
          return EVar6;
        }
        goto LAB_00117e96;
      }
    }
    else if ((!bVar1) ||
            (bVar1 = RAAssignment::isPhysDirty(other,group,uVar3), this_00 = other, bVar1)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
                 ,0x133,"dst.isPhysDirty(group, physId) && !cur.isPhysDirty(group, physId)");
    }
    RAAssignment::makeDirty(this_00,group,uVar5,uVar3);
  }
LAB_00117e96:
  uVar4 = RAAssignment::physToWorkId(&dst,group,uVar3);
  uVar5 = RAAssignment::physToWorkId(other,group,uVar3);
  if (uVar4 != uVar5) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
               ,0x13a,"dst.physToWorkId(group, physId) == cur.physToWorkId(group, physId)");
  }
  bVar1 = RAAssignment::isPhysDirty(&dst,group,uVar3);
  bVar2 = RAAssignment::isPhysDirty(other,group,uVar3);
  if (bVar1 != bVar2) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
               ,0x13b,"dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId)");
  }
  local_9c = local_9c & uVar8;
  local_b4 = -1;
  BVar7 = it;
  goto LAB_00117bae;
}

Assistant:

Error RALocalAllocator::switchToAssignment(
  PhysToWorkMap* dstPhysToWorkMap,
  WorkToPhysMap* dstWorkToPhysMap,
  const ZoneBitVector& liveIn,
  bool dstReadOnly,
  bool tryMode) noexcept {

  RAAssignment dst;
  RAAssignment& cur = _curAssignment;

  dst.initLayout(_pass->_physRegCount, _pass->workRegs());
  dst.initMaps(dstPhysToWorkMap, dstWorkToPhysMap);

  if (tryMode)
    return kErrorOk;

  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    // ------------------------------------------------------------------------
    // STEP 1:
    //   - KILL all registers that are not live at `dst`,
    //   - SPILL all registers that are not assigned at `dst`.
    // ------------------------------------------------------------------------

    if (!tryMode) {
      Support::BitWordIterator<uint32_t> it(cur.assigned(group));
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t workId = cur.physToWorkId(group, physId);

        // Must be true as we iterate over assigned registers.
        ASMJIT_ASSERT(workId != RAAssignment::kWorkNone);

        // KILL if it's not live on entry.
        if (!liveIn.bitAt(workId)) {
          onKillReg(group, workId, physId);
          continue;
        }

        // SPILL if it's not assigned on entry.
        uint32_t altId = dst.workToPhysId(group, workId);
        if (altId == RAAssignment::kPhysNone) {
          ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
        }
      }
    }

    // ------------------------------------------------------------------------
    // STEP 2:
    //   - MOVE and SWAP registers from their current assignments into their
    //     DST assignments.
    //   - Build `willLoadRegs` mask of registers scheduled for `onLoadReg()`.
    // ------------------------------------------------------------------------

    // Current run-id (1 means more aggressive decisions).
    int32_t runId = -1;
    // Remaining registers scheduled for `onLoadReg()`.
    uint32_t willLoadRegs = 0;
    // Remaining registers to be allocated in this loop.
    uint32_t affectedRegs = dst.assigned(group);

    while (affectedRegs) {
      if (++runId == 2) {
        if (!tryMode)
          return DebugUtils::errored(kErrorInvalidState);

        // Stop in `tryMode` if we haven't done anything in past two rounds.
        break;
      }

      Support::BitWordIterator<uint32_t> it(affectedRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t physMask = Support::bitMask(physId);

        uint32_t curWorkId = cur.physToWorkId(group, physId);
        uint32_t dstWorkId = dst.physToWorkId(group, physId);

        // The register must have assigned `dstWorkId` as we only iterate over assigned regs.
        ASMJIT_ASSERT(dstWorkId != RAAssignment::kWorkNone);

        if (curWorkId != RAAssignment::kWorkNone) {
          // Both assigned.
          if (curWorkId != dstWorkId) {
            // Wait a bit if this is the first run, we may avoid this if `curWorkId` moves out.
            if (runId <= 0)
              continue;

            uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
            if (altPhysId == RAAssignment::kPhysNone)
              continue;

            // Reset as we will do some changes to the current assignment.
            runId = -1;

            if (_archTraits->hasSwap(group)) {
              ASMJIT_PROPAGATE(onSwapReg(group, curWorkId, physId, dstWorkId, altPhysId));
            }
            else {
              // SPILL the reg if it's not dirty in DST, otherwise try to MOVE.
              if (!cur.isPhysDirty(group, physId)) {
                ASMJIT_PROPAGATE(onKillReg(group, curWorkId, physId));
              }
              else {
                uint32_t allocableRegs = _pass->_availableRegs[group] & ~cur.assigned(group);

                // If possible don't conflict with assigned regs at DST.
                if (allocableRegs & ~dst.assigned(group))
                  allocableRegs &= ~dst.assigned(group);

                if (allocableRegs) {
                  // MOVE is possible, thus preferred.
                  uint32_t tmpPhysId = Support::ctz(allocableRegs);

                  ASMJIT_PROPAGATE(onMoveReg(group, curWorkId, tmpPhysId, physId));
                  _pass->_clobberedRegs[group] |= Support::bitMask(tmpPhysId);
                }
                else {
                  // MOVE is impossible, must SPILL.
                  ASMJIT_PROPAGATE(onSpillReg(group, curWorkId, physId));
                }
              }

              goto Cleared;
            }
          }
        }
        else {
Cleared:
          // DST assigned, CUR unassigned.
          uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
          if (altPhysId == RAAssignment::kPhysNone) {
            if (liveIn.bitAt(dstWorkId))
              willLoadRegs |= physMask; // Scheduled for `onLoadReg()`.
            affectedRegs &= ~physMask;  // Unaffected from now.
            continue;
          }
          ASMJIT_PROPAGATE(onMoveReg(group, dstWorkId, physId, altPhysId));
        }

        // Both DST and CUR assigned to the same reg or CUR just moved to DST.
        if ((dst.dirty(group) & physMask) != (cur.dirty(group) & physMask)) {
          if ((dst.dirty(group) & physMask) == 0) {
            // CUR dirty, DST not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(!dst.isPhysDirty(group, physId) && cur.isPhysDirty(group, physId));

            // If `dstReadOnly` is true it means that that block was already
            // processed and we cannot change from CLEAN to DIRTY. In that case
            // the register has to be saved as it cannot enter the block DIRTY.
            if (dstReadOnly)
              ASMJIT_PROPAGATE(onSaveReg(group, dstWorkId, physId));
            else
              dst.makeDirty(group, dstWorkId, physId);
          }
          else {
            // DST dirty, CUR not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(dst.isPhysDirty(group, physId) && !cur.isPhysDirty(group, physId));

            cur.makeDirty(group, dstWorkId, physId);
          }
        }

        // Must match now...
        ASMJIT_ASSERT(dst.physToWorkId(group, physId) == cur.physToWorkId(group, physId));
        ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));

        runId = -1;
        affectedRegs &= ~physMask;
      }
    }

    // ------------------------------------------------------------------------
    // STEP 3:
    //   - Load registers specified by `willLoadRegs`.
    // ------------------------------------------------------------------------

    {
      Support::BitWordIterator<uint32_t> it(willLoadRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();

        if (!cur.isPhysAssigned(group, physId)) {
          uint32_t workId = dst.physToWorkId(group, physId);

          // The algorithm is broken if it tries to load a register that is not in LIVE-IN.
          ASMJIT_ASSERT(liveIn.bitAt(workId) == true);

          ASMJIT_PROPAGATE(onLoadReg(group, workId, physId));
          if (dst.isPhysDirty(group, physId))
            cur.makeDirty(group, workId, physId);
          ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));
        }
        else {
          // Not possible otherwise.
          ASMJIT_ASSERT(tryMode == true);
        }
      }
    }
  }

  if (!tryMode) {
    // Hre is a code that dumps the conflicting part if something fails here:
    //   if (!dst.equals(cur)) {
    //     uint32_t physTotal = dst._layout.physTotal;
    //     uint32_t workCount = dst._layout.workCount;
    //
    //     for (uint32_t physId = 0; physId < physTotal; physId++) {
    //       uint32_t dstWorkId = dst._physToWorkMap->workIds[physId];
    //       uint32_t curWorkId = cur._physToWorkMap->workIds[physId];
    //       if (dstWorkId != curWorkId)
    //         fprintf(stderr, "[PhysIdWork] PhysId=%u WorkId[DST(%u) != CUR(%u)]\n", physId, dstWorkId, curWorkId);
    //     }
    //
    //     for (uint32_t workId = 0; workId < workCount; workId++) {
    //       uint32_t dstPhysId = dst._workToPhysMap->physIds[workId];
    //       uint32_t curPhysId = cur._workToPhysMap->physIds[workId];
    //       if (dstPhysId != curPhysId)
    //         fprintf(stderr, "[WorkToPhys] WorkId=%u PhysId[DST(%u) != CUR(%u)]\n", workId, dstPhysId, curPhysId);
    //     }
    //   }
    ASMJIT_ASSERT(dst.equals(cur));
  }

  return kErrorOk;
}